

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  
  if (end <= ptr) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr;
  pcVar8 = ptr + (uVar7 & 0xfffffffffffffffe);
  if ((uVar7 & 0xfffffffffffffffe) == 0) {
    pcVar8 = end;
  }
  if ((uVar7 & 1) == 0) {
    pcVar8 = end;
  }
  if (uVar7 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (0xdb < bVar1) {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1]))))
    goto switchD_005f59ad_caseD_3;
    goto switchD_005f59ad_caseD_1d;
  }
  if (bVar1 - 0xd8 < 4) {
switchD_005f59ad_caseD_7:
    if ((long)pcVar8 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_005f59ad_caseD_3;
  }
  if (bVar1 != 0) {
switchD_005f59ad_caseD_1d:
    bVar2 = ptr[1];
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar2 >> 5) * 4))
         >> (bVar2 & 0x1f) & 1) != 0) {
switchD_005f59ad_caseD_16:
      iVar5 = 0x12;
      bVar4 = false;
LAB_005f5a6b:
      pcVar8 = pcVar8 + (-2 - (long)ptr);
      if ((long)pcVar8 < 2) {
LAB_005f5b26:
        return -iVar5;
      }
      pcVar9 = ptr + 4;
LAB_005f5a95:
      bVar1 = pcVar9[-2];
      if (0xdb < bVar1) {
        if (bVar1 == 0xff) {
          if ((byte)pcVar9[-1] < 0xfe) goto switchD_005f5ac5_caseD_1d;
        }
        else if (3 < bVar1 - 0xdc) goto switchD_005f5ac5_caseD_1d;
        goto switchD_005f5ac5_caseD_5;
      }
      if (bVar1 != 0) {
        if (3 < bVar1 - 0xd8) goto switchD_005f5ac5_caseD_1d;
switchD_005f5ac5_caseD_7:
        if (pcVar8 < (char *)0x4) {
          return -2;
        }
        goto switchD_005f5ac5_caseD_5;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar9[-1])) {
      case 6:
        if (pcVar8 == (char *)0x2) {
          return -2;
        }
        break;
      case 7:
        goto switchD_005f5ac5_caseD_7;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = pcVar9 + -2;
        return iVar5;
      case 0xf:
        if (!bVar4) {
          *nextTokPtr = pcVar9;
          return 0x1e;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_005f5ac5_caseD_16;
      case 0x1d:
switchD_005f5ac5_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)pcVar9[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)pcVar9[-1] & 0x1f) & 1) != 0) goto switchD_005f5ac5_caseD_16;
        break;
      case 0x21:
        if (!bVar4) {
          *nextTokPtr = pcVar9;
          return 0x1f;
        }
        break;
      case 0x22:
        if (!bVar4) {
          *nextTokPtr = pcVar9;
          return 0x20;
        }
      }
switchD_005f5ac5_caseD_5:
      ptr = pcVar9 + -2;
      goto switchD_005f59ad_caseD_3;
    }
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 +
                         (uint)(bVar2 >> 5) * 4)) & 1 << (bVar2 & 0x1f)) != 0)
    goto switchD_005f59ad_caseD_19;
    goto switchD_005f59ad_caseD_3;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 2:
    if ((long)pcVar8 - (long)(ptr + 2) < 2) {
      return -1;
    }
    bVar1 = ptr[2];
    if (3 < bVar1 - 0xdc) {
      if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        switch(bVar1) {
        case 0xf:
          iVar5 = big2_scanPi(enc,ptr + 4,pcVar8,nextTokPtr);
          return iVar5;
        case 0x10:
          iVar5 = big2_scanDecl(enc,ptr + 4,pcVar8,nextTokPtr);
          return iVar5;
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x17:
          break;
        case 0x16:
        case 0x18:
switchD_005f5e13_caseD_16:
          *nextTokPtr = ptr;
          return 0x1d;
        default:
          if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_005f5e13_caseD_16;
        }
      }
      else if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto switchD_005f5e13_caseD_16;
    }
    goto switchD_005f5dce_default;
  default:
    goto switchD_005f59ad_caseD_3;
  case 4:
    pcVar9 = ptr + 2;
    iVar5 = -0x1a;
    if (1 < (long)pcVar8 - (long)pcVar9) {
      if ((*pcVar9 == '\0') && (ptr[3] == ']')) {
        if ((ulong)((long)pcVar8 - (long)pcVar9) < 4) {
          return -1;
        }
        if ((ptr[4] == '\0') && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar9;
      iVar5 = 0x1a;
    }
    break;
  case 5:
    if ((long)pcVar8 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_005f59ad_caseD_3;
  case 6:
    if ((long)pcVar8 - (long)ptr < 3) {
      return -2;
    }
switchD_005f59ad_caseD_3:
    *nextTokPtr = ptr;
LAB_005f597b:
    iVar5 = 0;
    break;
  case 7:
    goto switchD_005f59ad_caseD_7;
  case 9:
    if (ptr + 2 == pcVar8) {
      *nextTokPtr = pcVar8;
      return -0xf;
    }
  case 10:
  case 0x15:
    pcVar9 = ptr + 2;
    lVar6 = (long)pcVar8 - (long)pcVar9;
    for (; ((1 < lVar6 && (*pcVar9 == '\0')) &&
           (((cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar9[1]), cVar3 == '\x15' ||
             (cVar3 == '\n')) || ((cVar3 == '\t' && (pcVar9 + 2 != pcVar8)))))); pcVar9 = pcVar9 + 2
        ) {
      lVar6 = lVar6 + -2;
    }
    *nextTokPtr = pcVar9;
    iVar5 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x11;
    break;
  case 0xc:
    iVar5 = 0xc;
    goto LAB_005f5ce5;
  case 0xd:
    iVar5 = 0xd;
LAB_005f5ce5:
    iVar5 = big2_scanLit(iVar5,enc,ptr + 2,pcVar8,nextTokPtr);
    return iVar5;
  case 0x13:
    iVar5 = big2_scanPoundName(enc,ptr + 2,pcVar8,nextTokPtr);
    return iVar5;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_005f59ad_caseD_16;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_005f59ad_caseD_19:
    iVar5 = 0x13;
    bVar4 = true;
    goto LAB_005f5a6b;
  case 0x1d:
    goto switchD_005f59ad_caseD_1d;
  case 0x1e:
    iVar5 = big2_scanPercent(enc,ptr + 2,pcVar8,nextTokPtr);
    return iVar5;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x17;
    break;
  case 0x20:
    pcVar9 = ptr + 2;
    if ((long)pcVar8 - (long)pcVar9 < 2) {
      return -0x18;
    }
    if (*pcVar9 == '\0') {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
      if (bVar1 < 0x20) {
        if (bVar1 - 9 < 3) {
switchD_005f5dce_caseD_20:
          *nextTokPtr = pcVar9;
          return 0x18;
        }
        if (bVar1 == 0xf) {
          *nextTokPtr = ptr + 4;
          return 0x23;
        }
        if (bVar1 == 0x15) goto switchD_005f5dce_caseD_20;
      }
      else {
        switch(bVar1) {
        case 0x20:
        case 0x23:
        case 0x24:
          goto switchD_005f5dce_caseD_20;
        case 0x21:
          *nextTokPtr = ptr + 4;
          return 0x24;
        case 0x22:
          *nextTokPtr = ptr + 4;
          return 0x25;
        }
      }
    }
switchD_005f5dce_default:
    *nextTokPtr = ptr + 2;
    goto LAB_005f597b;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x15;
  }
  return iVar5;
switchD_005f5ac5_caseD_16:
  pcVar8 = pcVar8 + -2;
  pcVar9 = pcVar9 + 2;
  if ((long)pcVar8 < 2) goto LAB_005f5b26;
  goto LAB_005f5a95;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}